

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

size_t __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::Check
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          bool checkCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *in_R8;
  ulong uVar7;
  
  if (((this->super_HeapBucket).heapInfo)->recycler->recyclerSweepManager !=
      (RecyclerSweepManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x764,"(this->GetRecycler()->recyclerSweepManager == nullptr)",
                       "this->GetRecycler()->recyclerSweepManager == nullptr");
    if (!bVar2) goto LAB_00639350;
    *puVar3 = 0;
  }
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::
  ForEachAllocator<Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::UpdateAllocators()::_lambda(Memory::SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>*)_1_>
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>> *)this
            );
  sVar4 = HeapInfo::Check<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->fullBlockList,0),
                     (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,in_R8);
  sVar5 = HeapInfo::Check<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->heapBlockList,0),
                     this->nextAllocableBlockHead,in_R8);
  sVar6 = HeapInfo::Check<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->nextAllocableBlockHead,0),
                     (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,in_R8);
  uVar7 = sVar6 + sVar5 + sVar4;
  if ((checkCount) && (uVar7 != (this->super_HeapBucket).heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x776,
                       "(!checkCount || this->heapBlockCount == smallHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || this->heapBlockCount == smallHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar2) {
LAB_00639350:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return uVar7;
}

Assistant:

size_t
HeapBucketT<TBlockType>::Check(bool checkCount)
{
    Assert(this->GetRecycler()->recyclerSweepManager == nullptr);
    UpdateAllocators();
    size_t smallHeapBlockCount = HeapInfo::Check(true, false, this->fullBlockList);
    bool allocatingDuringConcurrentSweep = false;
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        allocatingDuringConcurrentSweep = true;
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
        smallHeapBlockCount += HeapInfo::Check(true, false, this->sweepableHeapBlockList);
        debugSweepableHeapBlockListLock.Leave();
    }
#endif
    smallHeapBlockCount += HeapInfo::Check(true, false, this->heapBlockList, this->nextAllocableBlockHead);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->nextAllocableBlockHead);
    Assert(!checkCount || this->heapBlockCount == smallHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep));
    return smallHeapBlockCount;
}